

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyDsd.c
# Opt level: O0

int Ivy_TruthDsd(uint uTruth,Vec_Int_t *vTree)

{
  Vec_Int_t *pVVar1;
  int iVar2;
  uint uVar3;
  int local_20;
  int RetValue;
  int i;
  Ivy_Dec_t Node;
  Vec_Int_t *vTree_local;
  uint uTruth_local;
  
  _i = vTree;
  Vec_IntClear(vTree);
  for (local_20 = 0; local_20 < 5; local_20 = local_20 + 1) {
    Vec_IntPush(_i,0);
  }
  if ((uTruth == 0) || (uTruth == 0xffffffff)) {
    Ivy_DecClear((Ivy_Dec_t *)&RetValue);
    pVVar1 = _i;
    RetValue = RetValue & 0xffffffe0U | 1 | (uint)(uTruth == 0) << 4;
    iVar2 = Ivy_DecToInt((Ivy_Dec_t)RetValue);
    Vec_IntPush(pVVar1,iVar2);
    vTree_local._4_4_ = 1;
  }
  else {
    uVar3 = Ivy_TruthDecompose_rec(uTruth,_i);
    if (uVar3 == 0xffffffff) {
      vTree_local._4_4_ = 0;
    }
    else {
      if ((int)uVar3 >> 1 < 5) {
        Ivy_DecClear((Ivy_Dec_t *)&RetValue);
        pVVar1 = _i;
        RetValue = RetValue & 0xfffff0e0U | 2 | (uVar3 & 1) << 4 | ((int)uVar3 >> 1 & 7U) << 9;
        iVar2 = Ivy_DecToInt((Ivy_Dec_t)RetValue);
        Vec_IntPush(pVVar1,iVar2);
      }
      else if ((uVar3 & 1) != 0) {
        iVar2 = Vec_IntPop(_i);
        RetValue = (int)Ivy_IntToDec(iVar2);
        pVVar1 = _i;
        if (((uint)RetValue >> 4 & 1) != 0) {
          __assert_fail("Node.fCompl == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/ivy/ivyDsd.c"
                        ,199,"int Ivy_TruthDsd(unsigned int, Vec_Int_t *)");
        }
        RetValue = RetValue & 0xffffffefU | (uVar3 & 1) << 4;
        iVar2 = Ivy_DecToInt((Ivy_Dec_t)RetValue);
        Vec_IntPush(pVVar1,iVar2);
      }
      uVar3 = Ivy_TruthDsdCompute(_i);
      if (uTruth != uVar3) {
        printf("Verification failed.\n");
      }
      vTree_local._4_4_ = 1;
    }
  }
  return vTree_local._4_4_;
}

Assistant:

int Ivy_TruthDsd( unsigned uTruth, Vec_Int_t * vTree )
{
    Ivy_Dec_t Node;
    int i, RetValue;
    // set the PI variables
    Vec_IntClear( vTree );
    for ( i = 0; i < 5; i++ )
        Vec_IntPush( vTree, 0 );
    // check if it is a constant
    if ( uTruth == 0 || ~uTruth == 0 )
    {
        Ivy_DecClear( &Node );
        Node.Type = IVY_DEC_CONST1;
        Node.fCompl = (uTruth == 0);
        Vec_IntPush( vTree, Ivy_DecToInt(Node) );
        return 1;
    }
    // perform the decomposition
    RetValue = Ivy_TruthDecompose_rec( uTruth, vTree );
    if ( RetValue == -1 )
        return 0;
    // get the topmost node
    if ( (RetValue >> 1) < 5 )
    { // add buffer
        Ivy_DecClear( &Node );
        Node.Type = IVY_DEC_BUF;
        Node.fCompl = (RetValue & 1);
        Node.Fan0 = ((RetValue >> 1) << 1);
        Vec_IntPush( vTree, Ivy_DecToInt(Node) );
    }
    else if ( RetValue & 1 )
    { // check if the topmost node has to be complemented
        Node = Ivy_IntToDec( Vec_IntPop(vTree) );
        assert( Node.fCompl == 0 );
        Node.fCompl = (RetValue & 1);
        Vec_IntPush( vTree, Ivy_DecToInt(Node) );
    }
    if ( uTruth != Ivy_TruthDsdCompute(vTree) )
        printf( "Verification failed.\n" );
    return 1;
}